

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          value_type *value)

{
  unsigned_long_long uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  ulong uVar6;
  undefined8 *__s;
  void *pvVar7;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  undefined8 uVar8;
  long *cur;
  long lVar9;
  unsigned_long_long *in_RSI;
  int *in_RDI;
  undefined1 auVar10 [16];
  node *y;
  pair<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk_1;
  unsigned_long_long tmpk [100];
  long tmpv [100];
  node **x;
  int *pp;
  node **p;
  locType *pos;
  node *x_1;
  pair<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  int j;
  int i;
  long vt;
  unsigned_long_long vkey;
  unsigned_long_long in_stack_fffffffffffff8e0;
  unsigned_long_long in_stack_fffffffffffff8e8;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_fffffffffffff8f0;
  byte local_6e3;
  byte local_6e2;
  bool local_6e1;
  undefined8 local_6c0;
  unsigned_long_long auStack_6b8 [100];
  unsigned_long_long auStack_398 [98];
  locType *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  node **in_stack_ffffffffffffff88;
  unsigned_long_long *in_stack_ffffffffffffff98;
  int local_30;
  int local_2c;
  unsigned_long_long local_20 [3];
  bool local_1;
  unsigned_long_long *puVar5;
  
  local_20[0] = *in_RSI;
  uVar1 = in_RSI[1];
  if (*in_RDI == 0) {
    auVar10 = (**(code **)(**(long **)(in_RDI + 4) + 8))();
    puVar5 = auVar10._0_8_;
    *(long *)(in_RDI + 2) = auVar10._8_8_;
    *in_RDI = 1;
    *(undefined4 *)(puVar5 + 200) = 1;
    puVar5[0x65] = local_20[0];
    *puVar5 = uVar1;
    puVar5[100] = 0xffffffffffffffff;
    (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),in_RDI + 2);
    in_RDI[1] = 1;
    local_1 = true;
  }
  else {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)*in_RDI;
    uVar6 = SUB168(auVar10 * ZEXT816(8),0);
    if (SUB168(auVar10 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    __s = (undefined8 *)operator_new__(uVar6);
    memset(__s,0,8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*in_RDI;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar7 = operator_new__(uVar6);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)*in_RDI;
    uVar6 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    this_00 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
              operator_new__(uVar6);
    *__s = *(undefined8 *)(in_RDI + 2);
    for (local_2c = 0; local_2c < *in_RDI; local_2c = local_2c + 1) {
      uVar8 = (**(code **)(**(long **)(in_RDI + 4) + 0x10))(*(long **)(in_RDI + 4),__s + local_2c);
      *(undefined8 *)((long)pvVar7 + (long)local_2c * 8) = uVar8;
      local_30 = 0;
      while( true ) {
        local_6e1 = false;
        if (local_30 < *(int *)(*(long *)((long)pvVar7 + (long)local_2c * 8) + 0x640)) {
          local_6e1 = std::less<unsigned_long_long>::operator()
                                ((less<unsigned_long_long> *)&stack0xffffffffffffff9f,
                                 (unsigned_long_long *)
                                 (*(long *)((long)pvVar7 + (long)local_2c * 8) + 0x328 +
                                 (long)local_30 * 8),local_20);
        }
        if (local_6e1 == false) break;
        local_30 = local_30 + 1;
      }
      if (local_2c < *in_RDI + -1) {
        local_6e2 = 0;
        if (local_30 < *(int *)(*(long *)((long)pvVar7 + (long)local_2c * 8) + 0x640)) {
          bVar4 = std::less<unsigned_long_long>::operator()
                            ((less<unsigned_long_long> *)&stack0xffffffffffffff9e,local_20,
                             (unsigned_long_long *)
                             (*(long *)((long)pvVar7 + (long)local_2c * 8) + 0x328 +
                             (long)local_30 * 8));
          local_6e2 = bVar4 ^ 0xff;
        }
        if ((local_6e2 & 1) != 0) {
          local_30 = local_30 + 1;
        }
        __s[local_2c + 1] =
             *(undefined8 *)(*(long *)((long)pvVar7 + (long)local_2c * 8) + (long)local_30 * 8);
      }
      (&this_00->depth)[local_2c] = local_30;
    }
    local_6e3 = 0;
    if (local_30 < *(int *)(*(long *)((long)pvVar7 + (long)(*in_RDI + -1) * 8) + 0x640)) {
      bVar4 = std::less<unsigned_long_long>::operator()
                        ((less<unsigned_long_long> *)&stack0xffffffffffffff9d,local_20,
                         (unsigned_long_long *)
                         (*(long *)((long)pvVar7 + (long)(*in_RDI + -1) * 8) + 0x328 +
                         (long)local_30 * 8));
      local_6e3 = bVar4 ^ 0xff;
    }
    if ((local_6e3 & 1) == 0) {
      cur = (long *)((long)pvVar7 + (long)(*in_RDI + -1) * 8);
      if (local_30 == 0) {
        for (local_2c = *in_RDI + -2; -1 < local_2c; local_2c = local_2c + -1) {
          if (((&this_00->depth)[local_2c] != 0) &&
             (bVar4 = equal(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                            in_stack_fffffffffffff8e0), bVar4)) {
            *(unsigned_long_long *)
             (*(long *)((long)pvVar7 + (long)local_2c * 8) + 0x328 +
             (long)((&this_00->depth)[local_2c] + -1) * 8) = local_20[0];
            (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),__s + local_2c);
            break;
          }
        }
      }
      if (*(int *)(*cur + 0x640) < 99) {
        for (local_2c = *(int *)(*cur + 0x640); local_30 < local_2c; local_2c = local_2c + -1) {
          *(undefined8 *)(*cur + 0x328 + (long)local_2c * 8) =
               *(undefined8 *)(*cur + 0x328 + (long)(local_2c + -1) * 8);
          *(undefined8 *)(*cur + (long)local_2c * 8) =
               *(undefined8 *)(*cur + (long)(local_2c + -1) * 8);
        }
        *(unsigned_long_long *)(*cur + 0x328 + (long)local_30 * 8) = local_20[0];
        *(unsigned_long_long *)(*cur + (long)local_30 * 8) = uVar1;
        *(int *)(*cur + 0x640) = *(int *)(*cur + 0x640) + 1;
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),__s + (*in_RDI + -1));
      }
      else {
        auVar10 = (**(code **)(**(long **)(in_RDI + 4) + 8))();
        local_6c0 = auVar10._8_8_;
        lVar9 = auVar10._0_8_;
        for (local_2c = 0; local_2c < local_30; local_2c = local_2c + 1) {
          auStack_398[local_2c] = *(unsigned_long_long *)(*cur + (long)local_2c * 8);
          auStack_6b8[local_2c] = *(unsigned_long_long *)(*cur + 0x328 + (long)local_2c * 8);
        }
        auStack_398[local_30] = uVar1;
        auStack_6b8[local_30] = local_20[0];
        while (local_2c = local_30 + 1, local_2c < 100) {
          auStack_398[local_2c] = *(unsigned_long_long *)(*cur + (long)local_30 * 8);
          auStack_6b8[local_2c] = *(unsigned_long_long *)(*cur + 0x328 + (long)local_30 * 8);
          local_30 = local_2c;
        }
        *(undefined8 *)(lVar9 + 800) = *(undefined8 *)(*cur + 800);
        *(undefined4 *)(*cur + 0x640) = 0x32;
        for (local_2c = 0; local_2c < *(int *)(*cur + 0x640); local_2c = local_2c + 1) {
          *(unsigned_long_long *)(*cur + (long)local_2c * 8) = auStack_398[local_2c];
          *(unsigned_long_long *)(*cur + 0x328 + (long)local_2c * 8) = auStack_6b8[local_2c];
        }
        *(undefined8 *)(*cur + 800) = local_6c0;
        for (local_2c = *(int *)(*cur + 0x640); local_2c < 100; local_2c = local_2c + 1) {
          *(unsigned_long_long *)(lVar9 + (long)(local_2c - *(int *)(*cur + 0x640)) * 8) =
               auStack_398[local_2c];
          *(unsigned_long_long *)(lVar9 + 0x328 + (long)(local_2c - *(int *)(*cur + 0x640)) * 8) =
               auStack_6b8[local_2c];
        }
        *(int *)(lVar9 + 0x640) = 100 - *(int *)(*cur + 0x640);
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),&local_6c0);
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),__s + (*in_RDI + -1));
        insertnonleaf(this_00,in_stack_ffffffffffffff98,(int *)cur,in_stack_ffffffffffffff88,
                      in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(locType)__s);
      }
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      if (this_00 != (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x0
         ) {
        operator_delete__(this_00);
      }
      if (__s != (undefined8 *)0x0) {
        operator_delete__(__s);
      }
      in_RDI[1] = in_RDI[1] + 1;
      local_1 = true;
    }
    else {
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      if (this_00 != (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x0
         ) {
        operator_delete__(this_00);
      }
      if (__s != (undefined8 *)0x0) {
        operator_delete__(__s);
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }